

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load(CImg<unsigned_char> *this,char *filename)

{
  uint mode;
  int iVar1;
  char *pcVar2;
  uint *puVar3;
  CImgArgumentException *this_00;
  CImg<unsigned_char> *pCVar4;
  CImgIOException *this_01;
  CImg<char> filename_local;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar2 = "non-";
    if (this->_is_shared != false) {
      pcVar2 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar2,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  iVar1 = cimg::strncasecmp(filename,"http://",7);
  if ((iVar1 != 0) && (iVar1 = cimg::strncasecmp(filename,"https://",8), iVar1 != 0)) {
    pcVar2 = cimg::split_filename(filename,(char *)0x0);
    puVar3 = cimg::exception_mode();
    mode = *puVar3;
    cimg::exception_mode(0);
    iVar1 = cimg::strcasecmp(pcVar2,"asc");
    if (iVar1 == 0) {
      load_ascii(this,filename);
    }
    else {
      iVar1 = cimg::strcasecmp(pcVar2,"dlm");
      if ((iVar1 == 0) || (iVar1 = cimg::strcasecmp(pcVar2,"txt"), iVar1 == 0)) {
        load_dlm(this,filename);
      }
      else {
        iVar1 = cimg::strcasecmp(pcVar2,"bmp");
        if (iVar1 == 0) {
          load_bmp(this,filename);
        }
        else {
          iVar1 = cimg::strcasecmp(pcVar2,"jpg");
          if ((((iVar1 == 0) || (iVar1 = cimg::strcasecmp(pcVar2,"jpeg"), iVar1 == 0)) ||
              (iVar1 = cimg::strcasecmp(pcVar2,"jpe"), iVar1 == 0)) ||
             ((iVar1 = cimg::strcasecmp(pcVar2,"jfif"), iVar1 == 0 ||
              (iVar1 = cimg::strcasecmp(pcVar2,"jif"), iVar1 == 0)))) {
            load_jpeg(this,filename);
          }
          else {
            iVar1 = cimg::strcasecmp(pcVar2,"png");
            if (iVar1 == 0) {
              load_png(this,filename);
            }
            else {
              iVar1 = cimg::strcasecmp(pcVar2,"ppm");
              if (((iVar1 == 0) || (iVar1 = cimg::strcasecmp(pcVar2,"pgm"), iVar1 == 0)) ||
                 ((iVar1 = cimg::strcasecmp(pcVar2,"pnm"), iVar1 == 0 ||
                  ((iVar1 = cimg::strcasecmp(pcVar2,"pbm"), iVar1 == 0 ||
                   (iVar1 = cimg::strcasecmp(pcVar2,"pnk"), iVar1 == 0)))))) {
                load_pnm(this,filename);
              }
              else {
                iVar1 = cimg::strcasecmp(pcVar2,"pfm");
                if (iVar1 == 0) {
                  load_pfm(this,filename);
                }
                else {
                  iVar1 = cimg::strcasecmp(pcVar2,"tif");
                  if ((iVar1 == 0) || (iVar1 = cimg::strcasecmp(pcVar2,"tiff"), iVar1 == 0)) {
                    load_tiff(this,filename,0,0xffffffff,1,(float *)0x0,(CImg<char> *)0x0);
                  }
                  else {
                    iVar1 = cimg::strcasecmp(pcVar2,"exr");
                    if (iVar1 == 0) {
                      load_exr(this,filename);
                    }
                    else {
                      iVar1 = cimg::strcasecmp(pcVar2,"cr2");
                      if (((((iVar1 == 0) || (iVar1 = cimg::strcasecmp(pcVar2,"crw"), iVar1 == 0))
                           || (iVar1 = cimg::strcasecmp(pcVar2,"dcr"), iVar1 == 0)) ||
                          ((((iVar1 = cimg::strcasecmp(pcVar2,"mrw"), iVar1 == 0 ||
                             (iVar1 = cimg::strcasecmp(pcVar2,"nef"), iVar1 == 0)) ||
                            ((iVar1 = cimg::strcasecmp(pcVar2,"orf"), iVar1 == 0 ||
                             ((iVar1 = cimg::strcasecmp(pcVar2,"pix"), iVar1 == 0 ||
                              (iVar1 = cimg::strcasecmp(pcVar2,"ptx"), iVar1 == 0)))))) ||
                           (iVar1 = cimg::strcasecmp(pcVar2,"raf"), iVar1 == 0)))) ||
                         (iVar1 = cimg::strcasecmp(pcVar2,"srf"), iVar1 == 0)) {
                        load_dcraw_external(this,filename);
                      }
                      else {
                        iVar1 = cimg::strcasecmp(pcVar2,"gif");
                        if (iVar1 == 0) {
                          load_gif_external(this,filename,'z',0.0);
                        }
                        else {
                          iVar1 = cimg::strcasecmp(pcVar2,"dcm");
                          if ((iVar1 == 0) || (iVar1 = cimg::strcasecmp(pcVar2,"dicom"), iVar1 == 0)
                             ) {
                            load_medcon_external(this,filename);
                          }
                          else {
                            iVar1 = cimg::strcasecmp(pcVar2,"hdr");
                            if ((iVar1 == 0) || (iVar1 = cimg::strcasecmp(pcVar2,"nii"), iVar1 == 0)
                               ) {
                              load_analyze(this,filename,(float *)0x0);
                            }
                            else {
                              iVar1 = cimg::strcasecmp(pcVar2,"par");
                              if ((iVar1 == 0) ||
                                 (iVar1 = cimg::strcasecmp(pcVar2,"rec"), iVar1 == 0)) {
                                load_parrec(this,filename,'c',0.0);
                              }
                              else {
                                iVar1 = cimg::strcasecmp(pcVar2,"mnc");
                                if (iVar1 == 0) {
                                  load_minc2(this,filename);
                                }
                                else {
                                  iVar1 = cimg::strcasecmp(pcVar2,"inr");
                                  if (iVar1 == 0) {
                                    load_inr(this,filename,(float *)0x0);
                                  }
                                  else {
                                    iVar1 = cimg::strcasecmp(pcVar2,"pan");
                                    if (iVar1 == 0) {
                                      load_pandore(this,filename);
                                    }
                                    else {
                                      iVar1 = cimg::strcasecmp(pcVar2,"cimg");
                                      if (((iVar1 == 0) ||
                                          (iVar1 = cimg::strcasecmp(pcVar2,"cimgz"), iVar1 == 0)) ||
                                         (*pcVar2 == '\0')) {
                                        pCVar4 = load_cimg(this,filename,'z',0.0);
                                        return pCVar4;
                                      }
                                      iVar1 = cimg::strcasecmp(pcVar2,"gz");
                                      if (iVar1 == 0) {
                                        load_gzip_external(this,filename);
                                      }
                                      else {
                                        iVar1 = cimg::strcasecmp(pcVar2,"avi");
                                        if (((((iVar1 != 0) &&
                                              (iVar1 = cimg::strcasecmp(pcVar2,"mov"), iVar1 != 0))
                                             && ((iVar1 = cimg::strcasecmp(pcVar2,"asf"), iVar1 != 0
                                                 && ((iVar1 = cimg::strcasecmp(pcVar2,"divx"),
                                                     iVar1 != 0 &&
                                                     (iVar1 = cimg::strcasecmp(pcVar2,"flv"),
                                                     iVar1 != 0)))))) &&
                                            ((iVar1 = cimg::strcasecmp(pcVar2,"mpg"), iVar1 != 0 &&
                                             (((((((iVar1 = cimg::strcasecmp(pcVar2,"m1v"),
                                                   iVar1 != 0 &&
                                                   (iVar1 = cimg::strcasecmp(pcVar2,"m2v"),
                                                   iVar1 != 0)) &&
                                                  (iVar1 = cimg::strcasecmp(pcVar2,"m4v"),
                                                  iVar1 != 0)) &&
                                                 ((iVar1 = cimg::strcasecmp(pcVar2,"mjp"),
                                                  iVar1 != 0 &&
                                                  (iVar1 = cimg::strcasecmp(pcVar2,"mp4"),
                                                  iVar1 != 0)))) &&
                                                (iVar1 = cimg::strcasecmp(pcVar2,"mkv"), iVar1 != 0)
                                                ) && ((iVar1 = cimg::strcasecmp(pcVar2,"mpe"),
                                                      iVar1 != 0 &&
                                                      (iVar1 = cimg::strcasecmp(pcVar2,"movie"),
                                                      iVar1 != 0)))) &&
                                              ((iVar1 = cimg::strcasecmp(pcVar2,"ogm"), iVar1 != 0
                                               && (((iVar1 = cimg::strcasecmp(pcVar2,"ogg"),
                                                    iVar1 != 0 &&
                                                    (iVar1 = cimg::strcasecmp(pcVar2,"ogv"),
                                                    iVar1 != 0)) &&
                                                   (iVar1 = cimg::strcasecmp(pcVar2,"qt"),
                                                   iVar1 != 0)))))))))) &&
                                           ((((iVar1 = cimg::strcasecmp(pcVar2,"rm"), iVar1 != 0 &&
                                              (iVar1 = cimg::strcasecmp(pcVar2,"vob"), iVar1 != 0))
                                             && (iVar1 = cimg::strcasecmp(pcVar2,"wmv"), iVar1 != 0)
                                             ) && ((iVar1 = cimg::strcasecmp(pcVar2,"xvid"),
                                                   iVar1 != 0 &&
                                                   (iVar1 = cimg::strcasecmp(pcVar2,"mpeg"),
                                                   iVar1 != 0)))))) {
                                          this_01 = (CImgIOException *)
                                                    __cxa_allocate_exception(0x10);
                                          CImgIOException::CImgIOException
                                                    (this_01,"CImg<%s>::load()","unsigned char");
                                          __cxa_throw(this_01,&CImgIOException::typeinfo,
                                                      CImgException::~CImgException);
                                        }
                                        load_video(this,filename,0,0xffffffff,1,'z',0.0);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    cimg::exception_mode(mode);
    return this;
  }
  CImg<char>::CImg(&filename_local,0x100,1,1,1);
  pcVar2 = cimg::load_network(filename,filename_local._data,0,false);
  load(this,pcVar2);
  remove(filename_local._data);
  CImg<char>::~CImg(&filename_local);
  return this;
}

Assistant:

CImg<T>& load(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load(): Specified filename is (null).",
                                    cimg_instance);

      if (!cimg::strncasecmp(filename,"http://",7) || !cimg::strncasecmp(filename,"https://",8)) {
        CImg<charT> filename_local(256);
        load(cimg::load_network(filename,filename_local));
        std::remove(filename_local);
        return *this;
      }

      const char *const ext = cimg::split_filename(filename);
      const unsigned int omode = cimg::exception_mode();
      cimg::exception_mode(0);
      try {
#ifdef cimg_load_plugin
        cimg_load_plugin(filename);
#endif
#ifdef cimg_load_plugin1
        cimg_load_plugin1(filename);
#endif
#ifdef cimg_load_plugin2
        cimg_load_plugin2(filename);
#endif
#ifdef cimg_load_plugin3
        cimg_load_plugin3(filename);
#endif
#ifdef cimg_load_plugin4
        cimg_load_plugin4(filename);
#endif
#ifdef cimg_load_plugin5
        cimg_load_plugin5(filename);
#endif
#ifdef cimg_load_plugin6
        cimg_load_plugin6(filename);
#endif
#ifdef cimg_load_plugin7
        cimg_load_plugin7(filename);
#endif
#ifdef cimg_load_plugin8
        cimg_load_plugin8(filename);
#endif
        // Ascii formats
        if (!cimg::strcasecmp(ext,"asc")) load_ascii(filename);
        else if (!cimg::strcasecmp(ext,"dlm") ||
                 !cimg::strcasecmp(ext,"txt")) load_dlm(filename);

        // 2d binary formats
        else if (!cimg::strcasecmp(ext,"bmp")) load_bmp(filename);
        else if (!cimg::strcasecmp(ext,"jpg") ||
                 !cimg::strcasecmp(ext,"jpeg") ||
                 !cimg::strcasecmp(ext,"jpe") ||
                 !cimg::strcasecmp(ext,"jfif") ||
                 !cimg::strcasecmp(ext,"jif")) load_jpeg(filename);
        else if (!cimg::strcasecmp(ext,"png")) load_png(filename);
        else if (!cimg::strcasecmp(ext,"ppm") ||
                 !cimg::strcasecmp(ext,"pgm") ||
                 !cimg::strcasecmp(ext,"pnm") ||
                 !cimg::strcasecmp(ext,"pbm") ||
                 !cimg::strcasecmp(ext,"pnk")) load_pnm(filename);
        else if (!cimg::strcasecmp(ext,"pfm")) load_pfm(filename);
        else if (!cimg::strcasecmp(ext,"tif") ||
                 !cimg::strcasecmp(ext,"tiff")) load_tiff(filename);
        else if (!cimg::strcasecmp(ext,"exr")) load_exr(filename);
        else if (!cimg::strcasecmp(ext,"cr2") ||
                 !cimg::strcasecmp(ext,"crw") ||
                 !cimg::strcasecmp(ext,"dcr") ||
                 !cimg::strcasecmp(ext,"mrw") ||
                 !cimg::strcasecmp(ext,"nef") ||
                 !cimg::strcasecmp(ext,"orf") ||
                 !cimg::strcasecmp(ext,"pix") ||
                 !cimg::strcasecmp(ext,"ptx") ||
                 !cimg::strcasecmp(ext,"raf") ||
                 !cimg::strcasecmp(ext,"srf")) load_dcraw_external(filename);
        else if (!cimg::strcasecmp(ext,"gif")) load_gif_external(filename);

        // 3d binary formats
        else if (!cimg::strcasecmp(ext,"dcm") ||
                 !cimg::strcasecmp(ext,"dicom")) load_medcon_external(filename);
        else if (!cimg::strcasecmp(ext,"hdr") ||
                 !cimg::strcasecmp(ext,"nii")) load_analyze(filename);
        else if (!cimg::strcasecmp(ext,"par") ||
                 !cimg::strcasecmp(ext,"rec")) load_parrec(filename);
        else if (!cimg::strcasecmp(ext,"mnc")) load_minc2(filename);
        else if (!cimg::strcasecmp(ext,"inr")) load_inr(filename);
        else if (!cimg::strcasecmp(ext,"pan")) load_pandore(filename);
        else if (!cimg::strcasecmp(ext,"cimg") ||
                 !cimg::strcasecmp(ext,"cimgz") ||
                 !*ext)  return load_cimg(filename);

        // Archive files
        else if (!cimg::strcasecmp(ext,"gz")) load_gzip_external(filename);

        // Image sequences
        else if (!cimg::strcasecmp(ext,"avi") ||
                 !cimg::strcasecmp(ext,"mov") ||
                 !cimg::strcasecmp(ext,"asf") ||
                 !cimg::strcasecmp(ext,"divx") ||
                 !cimg::strcasecmp(ext,"flv") ||
                 !cimg::strcasecmp(ext,"mpg") ||
                 !cimg::strcasecmp(ext,"m1v") ||
                 !cimg::strcasecmp(ext,"m2v") ||
                 !cimg::strcasecmp(ext,"m4v") ||
                 !cimg::strcasecmp(ext,"mjp") ||
                 !cimg::strcasecmp(ext,"mp4") ||
                 !cimg::strcasecmp(ext,"mkv") ||
                 !cimg::strcasecmp(ext,"mpe") ||
                 !cimg::strcasecmp(ext,"movie") ||
                 !cimg::strcasecmp(ext,"ogm") ||
                 !cimg::strcasecmp(ext,"ogg") ||
                 !cimg::strcasecmp(ext,"ogv") ||
                 !cimg::strcasecmp(ext,"qt") ||
                 !cimg::strcasecmp(ext,"rm") ||
                 !cimg::strcasecmp(ext,"vob") ||
                 !cimg::strcasecmp(ext,"wmv") ||
                 !cimg::strcasecmp(ext,"xvid") ||
                 !cimg::strcasecmp(ext,"mpeg")) load_video(filename);
        else throw CImgIOException("CImg<%s>::load()",
                                   pixel_type());
      } catch (CImgIOException&) {
        std::FILE *file = 0;
        try {
          file = cimg::fopen(filename,"rb");
        } catch (CImgIOException&) {
          cimg::exception_mode(omode);
          throw CImgIOException(_cimg_instance
                                "load(): Failed to open file '%s'.",
                                cimg_instance,
                                filename);
        }

        try {
          const char *const f_type = cimg::ftype(file,filename);
          std::fclose(file);
          if (!cimg::strcasecmp(f_type,"pnm")) load_pnm(filename);
          else if (!cimg::strcasecmp(f_type,"pfm")) load_pfm(filename);
          else if (!cimg::strcasecmp(f_type,"bmp")) load_bmp(filename);
          else if (!cimg::strcasecmp(f_type,"inr")) load_inr(filename);
          else if (!cimg::strcasecmp(f_type,"jpg")) load_jpeg(filename);
          else if (!cimg::strcasecmp(f_type,"pan")) load_pandore(filename);
          else if (!cimg::strcasecmp(f_type,"png")) load_png(filename);
          else if (!cimg::strcasecmp(f_type,"tif")) load_tiff(filename);
          else if (!cimg::strcasecmp(f_type,"gif")) load_gif_external(filename);
          else if (!cimg::strcasecmp(f_type,"dcm")) load_medcon_external(filename);
          else throw CImgIOException("CImg<%s>::load()",
                                     pixel_type());
        } catch (CImgIOException&) {
          try {
            load_other(filename);
          } catch (CImgIOException&) {
            cimg::exception_mode(omode);
            throw CImgIOException(_cimg_instance
                                  "load(): Failed to recognize format of file '%s'.",
                                  cimg_instance,
                                  filename);
          }
        }
      }
      cimg::exception_mode(omode);
      return *this;
    }